

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_map_s_unittest.cpp
# Opt level: O3

void __thiscall
SortMapSUnitTest_default_constructor_Test::TestBody(SortMapSUnitTest_default_constructor_Test *this)

{
  char *message;
  MyMap m;
  AssertHelper local_7c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_7b8;
  internal local_7b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7a8;
  undefined1 local_7a0 [1928];
  pointer local_18;
  undefined1 local_f;
  
  local_18 = (pointer)(local_7a0 + 8);
  local_7a0._0_8_ = 0;
  local_f = 0;
  local_7b8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_7c0.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_7b0,"static_cast<size_t>(0u)","m.size()",(unsigned_long *)&local_7b8,
             (unsigned_long *)&local_7c0);
  if (local_7b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7b8);
    if (local_7a8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_7a8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/sort_map_s_unittest.cpp"
               ,0x3f,message);
    testing::internal::AssertHelper::operator=(&local_7c0,(Message *)&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    if (local_7b8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_7b8._M_head_impl + 8))();
    }
  }
  if (local_7a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_7a8,local_7a8);
  }
  estl::
  vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
  ::destroy_elements((vector_s<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_30UL>
                      *)local_7a0);
  return;
}

Assistant:

TEST_F(SortMapSUnitTest, default_constructor)
{
    using MyMap = estl::sort_map_s<std::string, std::string, 30>;
    MyMap m;
    EXPECT_EQ(static_cast<size_t>(0u), m.size());
}